

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WAsmjsUtils.cpp
# Opt level: O1

void __thiscall WAsmJs::TypedRegisterAllocator::DumpLocalsInfo(TypedRegisterAllocator *this)

{
  RegisterSpace *pRVar1;
  int i;
  Types type;
  char16 local_78 [4];
  char16 typeName [16];
  char16 shortTypeName [16];
  
  type = INT32;
  do {
    if ((this->mExcludedMask >> (type & 0x1f) & 1) == 0) {
      RegisterSpace::GetTypeDebugName(type,local_78,0x10,false);
      RegisterSpace::GetTypeDebugName(type,typeName + 0xc,0x10,true);
      pRVar1 = GetRegisterSpace(this,type);
      Output::Print(L"     %-10s : %u locals (%u temps from %s%u)\n",local_78,
                    (ulong)(pRVar1->mFirstTmpReg - pRVar1->mNbConst),
                    (ulong)(pRVar1->mRegisterCount - pRVar1->mFirstTmpReg),typeName + 0xc);
    }
    type = type + INT64;
  } while (type != LIMIT);
  return;
}

Assistant:

void TypedRegisterAllocator::DumpLocalsInfo() const
    {
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            Types type = (Types)i;
            if (!IsTypeExcluded(type))
            {
                char16 typeName[16];
                char16 shortTypeName[16];
                RegisterSpace::GetTypeDebugName(type, typeName, 16);
                RegisterSpace::GetTypeDebugName(type, shortTypeName, 16, true);
                RegisterSpace* registerSpace = GetRegisterSpace(type);
                Output::Print(
                    _u("     %-10s : %u locals (%u temps from %s%u)\n"),
                    typeName,
                    registerSpace->GetVarCount(),
                    registerSpace->GetTmpCount(),
                    shortTypeName,
                    registerSpace->GetFirstTmpRegister());
            }
        }
    }